

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bound_aggregate_expression.cpp
# Opt level: O3

unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> __thiscall
duckdb::BoundAggregateExpression::Copy(BoundAggregateExpression *this)

{
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *puVar1;
  _Head_base<0UL,_duckdb::BoundOrderModifier_*,_false> _Var2;
  undefined1 auVar3 [8];
  pointer pEVar4;
  pointer pFVar5;
  pointer pBVar6;
  pointer *__ptr;
  Expression *in_RSI;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *child;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *this_00;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  new_children;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_68;
  undefined1 local_60 [8];
  _Head_base<0UL,_duckdb::BoundAggregateExpression_*,_false> local_58;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_50;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  local_48;
  
  local_48.
  super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.
  super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.
  super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ::std::
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  ::reserve((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
             *)&local_48,
            (long)(in_RSI[4].super_BaseExpression.query_location.index -
                  *(long *)((long)&in_RSI[4].super_BaseExpression.alias.field_2 + 8)) >> 3);
  this_00 = *(unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> **)
             ((long)&in_RSI[4].super_BaseExpression.alias.field_2 + 8);
  puVar1 = (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
           in_RSI[4].super_BaseExpression.query_location.index;
  if (this_00 != puVar1) {
    do {
      pEVar4 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
               operator->(this_00);
      (*(pEVar4->super_BaseExpression)._vptr_BaseExpression[0x11])(&local_68,pEVar4);
      ::std::
      vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
      ::
      emplace_back<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
                ((vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                  *)&local_48,
                 (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                 &local_68);
      if (local_68._M_head_impl != (Expression *)0x0) {
        (*((local_68._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
      }
      this_00 = this_00 + 1;
    } while (this_00 != puVar1);
  }
  if (in_RSI[4].return_type.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
      (element_type *)0x0) {
    local_68._M_head_impl = (Expression *)0x0;
  }
  else {
    pFVar5 = unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true>::
             operator->((unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true>
                         *)&in_RSI[4].return_type.type_info_);
    (*pFVar5->_vptr_FunctionData[2])(&local_68,pFVar5);
  }
  if (in_RSI[4].verification_stats.
      super_unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>._M_t.
      super___uniq_ptr_impl<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>.
      _M_t.
      super__Tuple_impl<0UL,_duckdb::BaseStatistics_*,_std::default_delete<duckdb::BaseStatistics>_>
      .super__Head_base<0UL,_duckdb::BaseStatistics_*,_false>._M_head_impl == (BaseStatistics *)0x0)
  {
    local_50._M_head_impl = (Expression *)0x0;
  }
  else {
    pEVar4 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
             operator->((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                         *)&in_RSI[4].verification_stats);
    (*(pEVar4->super_BaseExpression)._vptr_BaseExpression[0x11])(&local_50,pEVar4);
  }
  make_uniq<duckdb::BoundAggregateExpression,duckdb::AggregateFunction_const&,duckdb::vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,true>,duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,duckdb::unique_ptr<duckdb::FunctionData,std::default_delete<duckdb::FunctionData>,true>,duckdb::AggregateType_const&>
            ((duckdb *)&local_58,(AggregateFunction *)(in_RSI + 1),&local_48,
             (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
             &local_50,
             (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true> *)
             &local_68,
             (AggregateType *)
             &in_RSI[4].return_type.type_info_.internal.
              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  pBVar6 = unique_ptr<duckdb::BoundAggregateExpression,_std::default_delete<duckdb::BoundAggregateExpression>,_true>
           ::operator->((unique_ptr<duckdb::BoundAggregateExpression,_std::default_delete<duckdb::BoundAggregateExpression>,_true>
                         *)&local_58);
  Expression::CopyProperties(&pBVar6->super_Expression,in_RSI);
  if (in_RSI[5].super_BaseExpression._vptr_BaseExpression == (_func_int **)0x0) {
    local_60 = (undefined1  [8])0x0;
  }
  else {
    unique_ptr<duckdb::BoundOrderModifier,_std::default_delete<duckdb::BoundOrderModifier>,_true>::
    operator->((unique_ptr<duckdb::BoundOrderModifier,_std::default_delete<duckdb::BoundOrderModifier>,_true>
                *)(in_RSI + 5));
    BoundOrderModifier::Copy((BoundOrderModifier *)local_60);
  }
  pBVar6 = unique_ptr<duckdb::BoundAggregateExpression,_std::default_delete<duckdb::BoundAggregateExpression>,_true>
           ::operator->((unique_ptr<duckdb::BoundAggregateExpression,_std::default_delete<duckdb::BoundAggregateExpression>,_true>
                         *)&local_58);
  auVar3 = local_60;
  local_60 = (undefined1  [8])0x0;
  _Var2._M_head_impl =
       (pBVar6->order_bys).
       super_unique_ptr<duckdb::BoundOrderModifier,_std::default_delete<duckdb::BoundOrderModifier>_>
       ._M_t.
       super___uniq_ptr_impl<duckdb::BoundOrderModifier,_std::default_delete<duckdb::BoundOrderModifier>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::BoundOrderModifier_*,_std::default_delete<duckdb::BoundOrderModifier>_>
       .super__Head_base<0UL,_duckdb::BoundOrderModifier_*,_false>._M_head_impl;
  (pBVar6->order_bys).
  super_unique_ptr<duckdb::BoundOrderModifier,_std::default_delete<duckdb::BoundOrderModifier>_>.
  _M_t.
  super___uniq_ptr_impl<duckdb::BoundOrderModifier,_std::default_delete<duckdb::BoundOrderModifier>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::BoundOrderModifier_*,_std::default_delete<duckdb::BoundOrderModifier>_>
  .super__Head_base<0UL,_duckdb::BoundOrderModifier_*,_false>._M_head_impl =
       (BoundOrderModifier *)auVar3;
  if (_Var2._M_head_impl != (BoundOrderModifier *)0x0) {
    (**(code **)(*(long *)&(_Var2._M_head_impl)->super_BoundResultModifier + 8))();
    if (local_60 != (undefined1  [8])0x0) {
      (**(code **)(*(_func_int **)local_60 + 8))();
    }
  }
  (this->super_Expression).super_BaseExpression._vptr_BaseExpression =
       (_func_int **)local_58._M_head_impl;
  if (local_50._M_head_impl != (Expression *)0x0) {
    (*((local_50._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
  }
  if (local_68._M_head_impl != (Expression *)0x0) {
    (*((local_68._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
  }
  ::std::
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  ::~vector((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
             *)&local_48);
  return (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)
         (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)this;
}

Assistant:

unique_ptr<Expression> BoundAggregateExpression::Copy() const {
	vector<unique_ptr<Expression>> new_children;
	new_children.reserve(children.size());
	for (auto &child : children) {
		new_children.push_back(child->Copy());
	}
	auto new_bind_info = bind_info ? bind_info->Copy() : nullptr;
	auto new_filter = filter ? filter->Copy() : nullptr;
	auto copy = make_uniq<BoundAggregateExpression>(function, std::move(new_children), std::move(new_filter),
	                                                std::move(new_bind_info), aggr_type);
	copy->CopyProperties(*this);
	copy->order_bys = order_bys ? order_bys->Copy() : nullptr;
	return std::move(copy);
}